

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O1

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<float,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  iterator iVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  pthread_mutex_t *__mutex;
  ulong uVar8;
  vector<float,_std::allocator<float>_> *pvVar9;
  size_type __n;
  float __x;
  float fVar10;
  float fVar11;
  float u2;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  pthread_mutex_t *local_48;
  long local_40;
  ulong local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 == 0) {
    if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
        this->m_max_refinements) {
      LOCK();
      (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
           (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
      uVar8 = (ulong)uVar1;
      __x = ldexpf(1.0,-uVar1);
      local_50 = __x + __x;
      fVar10 = ceilf((this->m_t_max - __x) / local_50);
      fVar11 = fVar10;
      local_48 = __mutex;
      if (0x7f7fffff < (uint)ABS(fVar10)) {
        local_58 = fVar10;
        policies::detail::raise_error<boost::math::rounding_error,float>
                  ("boost::math::trunc<%1%>(%1%)",
                   "Value %1% can not be represented in the target integer type.",&local_58);
        fVar11 = 0.0;
      }
      if (ABS(fVar11) <= 2.1474836e+09) {
        __n = (size_type)(int)fVar11;
      }
      else {
        local_58 = fVar10;
        policies::detail::raise_error<boost::math::rounding_error,float>
                  ("boost::math::itrunc<%1%>(%1%)",
                   "Value %1% can not be represented in the target integer type.",&local_58);
        __n = 0;
      }
      std::vector<float,_std::allocator<float>_>::reserve
                ((this->m_abscissas).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
      std::vector<float,_std::allocator<float>_>::reserve
                ((this->m_weights).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
      fVar11 = this->m_t_max;
      uVar7 = 0;
      local_40 = uVar8 * 3;
      local_38 = uVar8;
      for (fVar10 = __x; lVar4 = local_40, __mutex = local_48, fVar10 < fVar11;
          fVar10 = fVar10 + local_50) {
        local_54 = this->m_t_crossover;
        bVar3 = fVar10 < local_54;
        pvVar9 = (this->m_abscissas).
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8;
        fVar11 = sinhf(fVar10);
        fVar11 = fVar11 * 1.5707964;
        if (local_54 <= fVar10) {
          local_4c = fVar11;
          local_54 = expf(fVar11);
          fVar11 = coshf(local_4c);
          local_58 = -1.0 / (fVar11 * local_54);
        }
        else {
          local_58 = tanhf(fVar11);
        }
        iVar2._M_current =
             (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                    (pvVar9,iVar2,&local_58);
        }
        else {
          *iVar2._M_current = local_58;
          (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        uVar7 = uVar7 + bVar3;
        fVar11 = this->m_t_max;
      }
      (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start[local_38] = uVar7;
      if (__x < this->m_t_max) {
        do {
          pvVar9 = (vector<float,_std::allocator<float>_> *)
                   ((long)&(((this->m_weights).
                             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data + lVar4 * 8);
          fVar11 = sinhf(__x);
          fVar11 = coshf(fVar11 * 1.5707964);
          fVar10 = coshf(__x);
          local_58 = (fVar10 * 1.5707964) / (fVar11 * fVar11);
          iVar2._M_current =
               (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (pvVar9,iVar2,&local_58);
          }
          else {
            *iVar2._M_current = local_58;
            (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          __x = __x + local_50;
        } while (__x < this->m_t_max);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar5);
  pthread_mutex_unlock(local_48);
  _Unwind_Resume(uVar6);
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }